

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjectsTests.cpp
# Opt level: O3

void __thiscall
DelayedObjects_basicMove_Test::~DelayedObjects_basicMove_Test(DelayedObjects_basicMove_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DelayedObjects, basicMove)
{
    DelayedObjects<std::string> objs;

    auto fut1 = objs.getFuture("string1");
    auto fut2 = objs.getFuture(45);

    std::string basicString(600, 'a');
    objs.setDelayedValue("string1", std::move(basicString));

    auto str1 = fut1.get();
    EXPECT_EQ(str1, std::string(600, 'a'));

    objs.setDelayedValue(45, std::move(str1));
    auto str2 = fut2.get();
    EXPECT_EQ(str2, std::string(600, 'a'));
}